

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O2

socket_handle FIX::createSocket(uint16_t port,char *address)

{
  int __fd;
  int iVar1;
  socket_handle in_stack_ffffffffffffffcc;
  sockaddr_in addr;
  
  __fd = socket(2,1,6);
  addr.sin_family = 2;
  addr.sin_port = port << 8 | port >> 8;
  addr.sin_addr.s_addr = inet_addr(address);
  iVar1 = connect(__fd,(sockaddr *)&addr,0x10);
  if (iVar1 != 0) {
    destroySocket(in_stack_ffffffffffffffcc);
    __fd = -1;
  }
  return __fd;
}

Assistant:

socket_handle inline createSocket(uint16_t port, const char *address) {
  socket_handle sock = socket(PF_INET, SOCK_STREAM, IPPROTO_TCP);

  sockaddr_in addr;
  addr.sin_family = PF_INET;
  addr.sin_port = htons(port);
  addr.sin_addr.s_addr = inet_addr(address);

  int result = ::connect(sock, reinterpret_cast<sockaddr *>(&addr), sizeof(addr));
  if (result != 0) {
    destroySocket(sock);
    return INVALID_SOCKET_HANDLE;
  }
  return sock;
}